

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mersennetwister.h
# Opt level: O2

void __thiscall MTRand::save(MTRand *this,uint32 *saveArray)

{
  long lVar1;
  uint32 *sa;
  uint32 *s;
  
  for (lVar1 = 0; (int)lVar1 != 0x270; lVar1 = lVar1 + 1) {
    saveArray[lVar1] = this->state[lVar1];
  }
  saveArray[lVar1] = (long)this->left;
  return;
}

Assistant:

void MTRand::save(uint32 *saveArray) const {
  uint32 *sa = saveArray;
  const uint32 *s = state;
  int i = N;
  for (; i--; *sa++ = *s++) {
  }
  *sa = left;
}